

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.cpp
# Opt level: O2

void __thiscall TPZStream::Read(TPZStream *this,Fad<long_double> *p,int howMany)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  Fad<double> *rhs;
  bool bVar6;
  Fad<long_double> local_68;
  
  lVar5 = (long)howMany * 0x20;
  uVar4 = 0xffffffffffffffff;
  if (-1 < howMany) {
    uVar4 = lVar5 + 8;
  }
  plVar2 = (long *)operator_new__(uVar4);
  rhs = (Fad<double> *)(plVar2 + 1);
  *plVar2 = (long)howMany;
  if (howMany != 0) {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)plVar2 + lVar3 + 8) = 0;
      *(undefined4 *)((long)plVar2 + lVar3 + 0x10) = 0;
      puVar1 = (undefined8 *)((long)plVar2 + lVar3 + 0x18);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar3 = lVar3 + 0x20;
    } while (lVar5 != lVar3);
  }
  (*this->_vptr_TPZStream[0x31])(this,rhs,(ulong)(uint)howMany);
  uVar4 = (ulong)(uint)howMany;
  while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
    Fad<long_double>::Fad<double,_nullptr>(&local_68,rhs);
    Fad<long_double>::operator=(p,&local_68);
    Vector<long_double>::destroy(&local_68.dx_);
    rhs = rhs + 1;
    p = p + 1;
  }
  lVar5 = *plVar2 * 0x20;
  uVar4 = lVar5 + 8;
  lVar3 = *plVar2;
  while (lVar3 != 0) {
    Vector<double>::destroy((Vector<double> *)((long)plVar2 + lVar5 + -0x10));
    lVar5 = lVar5 + -0x20;
    lVar3 = lVar5;
  }
  operator_delete__(plVar2,uVar4);
  return;
}

Assistant:

void TPZStream::Read(Fad<long double> *p, int howMany) {//weird but necessary for working between different OSs
    Fad<double> *copy = new Fad<double>[howMany];
    Read(copy, howMany);
    for (unsigned int i = 0; i < howMany; ++i) {
        p[i] = (Fad<long double>)copy[i];
    }
    delete[] copy;
}